

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_ReadFunctionTag(BCReaderState *s)

{
  JSContext *ctx;
  ushort *puVar1;
  JSRuntime *pJVar2;
  list_head *plVar3;
  ulong uVar4;
  bool bVar5;
  ushort uVar6;
  ushort uVar7;
  int iVar8;
  uint32_t uVar9;
  uint8_t *buf;
  undefined2 uVar10;
  long lVar11;
  uint32_t *puVar12;
  undefined8 *puVar13;
  JSValueUnion JVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  int64_t iVar18;
  long lVar19;
  byte bVar20;
  JSValue JVar21;
  JSValue JVar22;
  uint8_t v8;
  uint32_t val;
  int local_count;
  byte local_f1;
  JSValueUnion local_f0;
  JSValueUnion local_e8;
  int local_dc;
  ulong local_d8;
  ulong local_d0;
  JSValueUnion local_c8;
  uint local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  uint32_t uStack_90;
  undefined1 auStack_8c [4];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  bVar20 = 0;
  ctx = s->ctx;
  local_c8.float64 = 0.0;
  uStack_b0 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  _uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_b8 = 1;
  puVar1 = (ushort *)s->ptr;
  lVar15 = (long)s->buf_end - (long)puVar1;
  if (lVar15 < 2) {
    if (s->error_state == 0) {
      JS_ThrowSyntaxError(ctx,"read after the end of the buffer");
    }
    s->error_state = -1;
    uVar7 = 0;
  }
  else {
    uVar7 = *puVar1;
    s->ptr = (uint8_t *)(puVar1 + 1);
    uVar7 = uVar7 & 0xfff;
  }
  iVar18 = 3;
  if (lVar15 < 2) {
LAB_0013f153:
    bVar5 = false;
  }
  else {
    uVar6 = uStack_a0._1_2_ & 0xe000;
    uStack_a0._0_3_ =
         CONCAT21(uVar7 | uVar6 | (ushort)(*(uint *)&s->field_0x34 >> 4) & 0x1000,
                  (undefined1)uStack_a0);
    iVar8 = bc_get_u8(s,&local_f1);
    if (iVar8 != 0) goto LAB_0013f153;
    uStack_a0 = CONCAT71(uStack_a0._1_7_,local_f1);
    iVar8 = bc_get_atom(s,(JSAtom *)auStack_8c);
    if (iVar8 != 0) goto LAB_0013f153;
    iVar8 = bc_get_leb128(s,(uint32_t *)&local_e8.int32);
    bVar5 = false;
    uVar10 = 0;
    if (iVar8 == 0) {
      uVar10 = local_e8.int32._0_2_;
    }
    local_78 = CONCAT62(local_78._2_6_,uVar10);
    if (iVar8 == 0) {
      iVar8 = bc_get_leb128(s,(uint32_t *)&local_e8.int32);
      bVar5 = false;
      uVar10 = 0;
      if (iVar8 == 0) {
        uVar10 = local_e8.int32._0_2_;
      }
      local_78._0_4_ = CONCAT22(uVar10,(undefined2)local_78);
      if (iVar8 == 0) {
        iVar8 = bc_get_leb128(s,(uint32_t *)&local_e8.int32);
        bVar5 = false;
        uVar10 = 0;
        if (iVar8 == 0) {
          uVar10 = local_e8.int32._0_2_;
        }
        local_78._0_6_ = CONCAT24(uVar10,(undefined4)local_78);
        if (iVar8 == 0) {
          iVar8 = bc_get_leb128(s,(uint32_t *)&local_e8.int32);
          bVar5 = false;
          uVar10 = 0;
          if (iVar8 == 0) {
            uVar10 = local_e8.int32._0_2_;
          }
          local_78 = CONCAT26(uVar10,(undefined6)local_78);
          if (iVar8 == 0) {
            iVar8 = bc_get_leb128(s,(uint32_t *)((long)&uStack_60 + 4));
            if (((iVar8 != 0) || (iVar8 = bc_get_leb128(s,(uint32_t *)&uStack_60), iVar8 != 0)) ||
               (iVar8 = bc_get_leb128(s,&uStack_90), iVar8 != 0)) goto LAB_0013f153;
            iVar8 = bc_get_leb128(s,&local_bc);
            JVar14.float64 = 0.0;
            bVar5 = false;
            if (iVar8 == 0) {
              lVar15 = (ulong)(uStack_a0._1_2_ >> 5 & 0x20) + 0x60;
              local_d0 = uStack_60 & 0xffffffff;
              local_d8 = (ulong)local_bc;
              lVar19 = lVar15 << 0x20;
              lVar16 = ((ulong)(local_bc + (uint32_t)uStack_60) << 0x24) + lVar19;
              local_dc = (int)((ulong)lVar16 >> 0x20) + uStack_60._4_4_ * 8;
              uVar9 = 0;
              if ((uStack_a0._1_2_ >> 0xc & 1) == 0) {
                uVar9 = uStack_90;
              }
              local_f0.ptr = js_mallocz(ctx,(long)(int)(uVar9 + local_dc));
              if ((int *)local_f0.ptr == (int *)0x0) {
                iVar18 = 6;
                goto LAB_0013f191;
              }
              puVar13 = &local_b8;
              JVar14.ptr = local_f0.ptr;
              for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
                *(undefined8 *)JVar14.ptr = *puVar13;
                puVar13 = puVar13 + (ulong)bVar20 * -2 + 1;
                JVar14.float64 = JVar14.float64 + (ulong)bVar20 * -0x10 + 8;
              }
              *(int *)local_f0.ptr = 1;
              if (local_d8 != 0) {
                *(long *)((long)local_f0.ptr + 0x30) =
                     ((long)(lVar19 + (local_d0 << 0x24)) >> 0x20) + (long)local_f0.ptr;
              }
              if (*(int *)((long)local_f0.ptr + 0x5c) != 0) {
                *(long *)((long)local_f0.ptr + 0x38) = (lVar16 >> 0x20) + (long)local_f0.ptr;
              }
              if (*(int *)((long)local_f0.ptr + 0x58) != 0) {
                *(long *)((long)local_f0.ptr + 0x50) = lVar15 + (long)local_f0.ptr;
              }
              pJVar2 = ctx->rt;
              *(undefined1 *)((long)local_f0.ptr + 4) = 1;
              plVar3 = (pJVar2->gc_obj_list).prev;
              plVar3->next = (list_head *)((long)local_f0.ptr + 8);
              *(list_head **)((long)local_f0.ptr + 8) = plVar3;
              *(list_head **)((long)local_f0.ptr + 0x10) = &pJVar2->gc_obj_list;
              (pJVar2->gc_obj_list).prev = (list_head *)((long)local_f0.ptr + 8);
              local_c8.ptr = local_f0.ptr;
              if (0 < (int)local_d8) {
                local_d8 = local_d8 << 4;
                uVar17 = 0;
                iVar18 = -2;
                do {
                  uVar4 = *(ulong *)((long)local_f0.ptr + 0x30);
                  iVar8 = bc_get_atom(s,(JSAtom *)(uVar4 + uVar17));
                  bVar5 = true;
                  if ((iVar8 != 0) ||
                     (iVar8 = bc_get_leb128(s,(uint32_t *)(uVar17 + 4 + uVar4)), iVar8 != 0))
                  goto LAB_0013f156;
                  puVar12 = (uint32_t *)(uVar4 + uVar17 + 8);
                  local_d0 = uVar4;
                  iVar8 = bc_get_leb128(s,puVar12);
                  if (iVar8 != 0) goto LAB_0013f156;
                  *puVar12 = *puVar12 - 1;
                  iVar8 = bc_get_u8(s,&local_f1);
                  if (iVar8 != 0) goto LAB_0013f156;
                  bVar20 = local_f1 >> 4;
                  *(uint *)(local_d0 + 0xc + uVar17) =
                       bVar20 & 4 |
                       bVar20 & 2 |
                       bVar20 & 1 |
                       (*(uint *)(local_d0 + 0xc + uVar17) & 0xffffff80) + (local_f1 & 0xf) * 8;
                  uVar17 = uVar17 + 0x10;
                } while (local_d8 != uVar17);
              }
              if ((*(int *)((long)local_f0.ptr + 0x5c) != 0) &&
                 (0 < *(int *)((long)local_f0.ptr + 0x5c))) {
                lVar16 = 4;
                lVar15 = 0;
                do {
                  lVar19 = *(long *)((long)local_f0.ptr + 0x38);
                  iVar8 = bc_get_atom(s,(JSAtom *)(lVar19 + lVar16));
                  if ((iVar8 != 0) ||
                     (iVar8 = bc_get_leb128(s,(uint32_t *)&local_e8.int32), iVar8 != 0)) {
LAB_0013f605:
                    iVar18 = -2;
                    bVar5 = true;
                    goto LAB_0013f156;
                  }
                  *(undefined2 *)(lVar19 + 2 + lVar15 * 8) = local_e8.int32._0_2_;
                  iVar8 = bc_get_u8(s,&local_f1);
                  if (iVar8 != 0) goto LAB_0013f605;
                  *(byte *)(lVar19 + lVar15 * 8) = local_f1;
                  lVar15 = lVar15 + 1;
                  lVar16 = lVar16 + 8;
                } while (lVar15 < *(int *)((long)local_f0.ptr + 0x5c));
              }
              iVar8 = JS_ReadFunctionBytecode
                                (s,(JSFunctionBytecode *)local_f0.ptr,local_dc,
                                 *(uint32_t *)((long)local_f0.ptr + 0x28));
              iVar18 = -2;
              bVar5 = true;
              if (iVar8 == 0) {
                if ((*(byte *)((long)local_f0.ptr + 0x1a) & 4) == 0) goto LAB_0013f567;
                iVar8 = bc_get_atom(s,(JSAtom *)((long)local_f0.ptr + 0x60));
                if ((iVar8 == 0) &&
                   (iVar8 = bc_get_leb128(s,(uint32_t *)((long)local_f0.ptr + 100)), iVar8 == 0)) {
                  puVar12 = (uint32_t *)((long)local_f0.ptr + 0x6c);
                  iVar8 = bc_get_leb128(s,puVar12);
                  if (iVar8 == 0) {
                    if ((long)(int)*puVar12 != 0) {
                      buf = (uint8_t *)js_mallocz(ctx,(long)(int)*puVar12);
                      *(uint8_t **)((long)local_f0.ptr + 0x70) = buf;
                      if ((buf == (uint8_t *)0x0) ||
                         (iVar8 = bc_get_buf(s,buf,*puVar12), iVar8 != 0)) goto LAB_0013f156;
                    }
LAB_0013f567:
                    if ((*(int *)((long)local_f0.ptr + 0x58) != 0) &&
                       (0 < *(int *)((long)local_f0.ptr + 0x58))) {
                      lVar16 = 8;
                      lVar15 = 0;
                      do {
                        JVar22 = JS_ReadObjectRec(s);
                        if ((int)JVar22.tag == 6) goto LAB_0013f156;
                        lVar19 = *(long *)((long)local_f0.ptr + 0x50);
                        *(JSValueUnion *)(lVar19 + -8 + lVar16) = JVar22.u;
                        *(int64_t *)(lVar19 + lVar16) = JVar22.tag;
                        lVar15 = lVar15 + 1;
                        lVar16 = lVar16 + 0x10;
                      } while (lVar15 < *(int *)((long)local_f0.ptr + 0x58));
                    }
                    (ctx->header).ref_count = (ctx->header).ref_count + 1;
                    *(JSContext **)((long)local_f0.ptr + 0x48) = ctx;
                    iVar18 = -2;
                    JVar14 = local_c8;
                    goto LAB_0013f191;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0013f156:
  local_e8.float64 = local_c8.float64;
  if ((bVar5) && (iVar8 = *local_c8.ptr, *(int *)local_c8.ptr = iVar8 + -1, iVar8 < 2)) {
    JVar22.tag = iVar18;
    JVar22.u.ptr = local_c8.ptr;
    __JS_FreeValueRT(ctx->rt,JVar22);
  }
  iVar18 = 6;
  JVar14.float64 = 0.0;
LAB_0013f191:
  JVar21.tag = iVar18;
  JVar21.u.float64 = JVar14.float64;
  return JVar21;
}

Assistant:

static JSValue JS_ReadFunctionTag(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    JSFunctionBytecode bc, *b;
    JSValue obj = JS_UNDEFINED;
    uint16_t v16;
    uint8_t v8;
    int idx, i, local_count;
    int function_size, cpool_offset, byte_code_offset;
    int closure_var_offset, vardefs_offset;

    memset(&bc, 0, sizeof(bc));
    bc.header.ref_count = 1;
    //bc.gc_header.mark = 0;

    if (bc_get_u16(s, &v16))
        goto fail;
    idx = 0;
    bc.has_prototype = bc_get_flags(v16, &idx, 1);
    bc.has_simple_parameter_list = bc_get_flags(v16, &idx, 1);
    bc.is_derived_class_constructor = bc_get_flags(v16, &idx, 1);
    bc.need_home_object = bc_get_flags(v16, &idx, 1);
    bc.func_kind = bc_get_flags(v16, &idx, 2);
    bc.new_target_allowed = bc_get_flags(v16, &idx, 1);
    bc.super_call_allowed = bc_get_flags(v16, &idx, 1);
    bc.super_allowed = bc_get_flags(v16, &idx, 1);
    bc.arguments_allowed = bc_get_flags(v16, &idx, 1);
    bc.has_debug = bc_get_flags(v16, &idx, 1);
    bc.backtrace_barrier = bc_get_flags(v16, &idx, 1);
    bc.read_only_bytecode = s->is_rom_data;
    if (bc_get_u8(s, &v8))
        goto fail;
    bc.js_mode = v8;
    if (bc_get_atom(s, &bc.func_name))  //@ atom leak if failure
        goto fail;
    if (bc_get_leb128_u16(s, &bc.arg_count))
        goto fail;
    if (bc_get_leb128_u16(s, &bc.var_count))
        goto fail;
    if (bc_get_leb128_u16(s, &bc.defined_arg_count))
        goto fail;
    if (bc_get_leb128_u16(s, &bc.stack_size))
        goto fail;
    if (bc_get_leb128_int(s, &bc.closure_var_count))
        goto fail;
    if (bc_get_leb128_int(s, &bc.cpool_count))
        goto fail;
    if (bc_get_leb128_int(s, &bc.byte_code_len))
        goto fail;
    if (bc_get_leb128_int(s, &local_count))
        goto fail;

    if (bc.has_debug) {
        function_size = sizeof(*b);
    } else {
        function_size = offsetof(JSFunctionBytecode, debug);
    }
    cpool_offset = function_size;
    function_size += bc.cpool_count * sizeof(*bc.cpool);
    vardefs_offset = function_size;
    function_size += local_count * sizeof(*bc.vardefs);
    closure_var_offset = function_size;
    function_size += bc.closure_var_count * sizeof(*bc.closure_var);
    byte_code_offset = function_size;
    if (!bc.read_only_bytecode) {
        function_size += bc.byte_code_len;
    }

    b = js_mallocz(ctx, function_size);
    if (!b)
        return JS_EXCEPTION;
            
    memcpy(b, &bc, offsetof(JSFunctionBytecode, debug));
    b->header.ref_count = 1;
    if (local_count != 0) {
        b->vardefs = (void *)((uint8_t*)b + vardefs_offset);
    }
    if (b->closure_var_count != 0) {
        b->closure_var = (void *)((uint8_t*)b + closure_var_offset);
    }
    if (b->cpool_count != 0) {
        b->cpool = (void *)((uint8_t*)b + cpool_offset);
    }
    
    add_gc_object(ctx->rt, &b->header, JS_GC_OBJ_TYPE_FUNCTION_BYTECODE);
            
    obj = JS_MKPTR(JS_TAG_FUNCTION_BYTECODE, b);

#ifdef DUMP_READ_OBJECT
    bc_read_trace(s, "name: "); print_atom(s->ctx, b->func_name); printf("\n");
#endif
    bc_read_trace(s, "args=%d vars=%d defargs=%d closures=%d cpool=%d\n",
                  b->arg_count, b->var_count, b->defined_arg_count,
                  b->closure_var_count, b->cpool_count);
    bc_read_trace(s, "stack=%d bclen=%d locals=%d\n",
                  b->stack_size, b->byte_code_len, local_count);

    if (local_count != 0) {
        bc_read_trace(s, "vars {\n");
        for(i = 0; i < local_count; i++) {
            JSVarDef *vd = &b->vardefs[i];
            if (bc_get_atom(s, &vd->var_name))
                goto fail;
            if (bc_get_leb128_int(s, &vd->scope_level))
                goto fail;
            if (bc_get_leb128_int(s, &vd->scope_next))
                goto fail;
            vd->scope_next--;
            if (bc_get_u8(s, &v8))
                goto fail;
            idx = 0;
            vd->var_kind = bc_get_flags(v8, &idx, 4);
            vd->is_const = bc_get_flags(v8, &idx, 1);
            vd->is_lexical = bc_get_flags(v8, &idx, 1);
            vd->is_captured = bc_get_flags(v8, &idx, 1);
#ifdef DUMP_READ_OBJECT
            bc_read_trace(s, "name: "); print_atom(s->ctx, vd->var_name); printf("\n");
#endif
        }
        bc_read_trace(s, "}\n");
    }
    if (b->closure_var_count != 0) {
        bc_read_trace(s, "closure vars {\n");
        for(i = 0; i < b->closure_var_count; i++) {
            JSClosureVar *cv = &b->closure_var[i];
            int var_idx;
            if (bc_get_atom(s, &cv->var_name))
                goto fail;
            if (bc_get_leb128_int(s, &var_idx))
                goto fail;
            cv->var_idx = var_idx;
            if (bc_get_u8(s, &v8))
                goto fail;
            idx = 0;
            cv->is_local = bc_get_flags(v8, &idx, 1);
            cv->is_arg = bc_get_flags(v8, &idx, 1);
            cv->is_const = bc_get_flags(v8, &idx, 1);
            cv->is_lexical = bc_get_flags(v8, &idx, 1);
            cv->var_kind = bc_get_flags(v8, &idx, 4);
#ifdef DUMP_READ_OBJECT
            bc_read_trace(s, "name: "); print_atom(s->ctx, cv->var_name); printf("\n");
#endif
        }
        bc_read_trace(s, "}\n");
    }
    {
        bc_read_trace(s, "bytecode {\n");
        if (JS_ReadFunctionBytecode(s, b, byte_code_offset, b->byte_code_len))
            goto fail;
        bc_read_trace(s, "}\n");
    }
    if (b->has_debug) {
        /* read optional debug information */
        bc_read_trace(s, "debug {\n");
        if (bc_get_atom(s, &b->debug.filename))
            goto fail;
        if (bc_get_leb128_int(s, &b->debug.line_num))
            goto fail;
        if (bc_get_leb128_int(s, &b->debug.pc2line_len))
            goto fail;
        if (b->debug.pc2line_len) {
            b->debug.pc2line_buf = js_mallocz(ctx, b->debug.pc2line_len);
            if (!b->debug.pc2line_buf)
                goto fail;
            if (bc_get_buf(s, b->debug.pc2line_buf, b->debug.pc2line_len))
                goto fail;
        }
#ifdef DUMP_READ_OBJECT
        bc_read_trace(s, "filename: "); print_atom(s->ctx, b->debug.filename); printf("\n");
#endif
        bc_read_trace(s, "}\n");
    }
    if (b->cpool_count != 0) {
        bc_read_trace(s, "cpool {\n");
        for(i = 0; i < b->cpool_count; i++) {
            JSValue val;
            val = JS_ReadObjectRec(s);
            if (JS_IsException(val))
                goto fail;
            b->cpool[i] = val;
        }
        bc_read_trace(s, "}\n");
    }
    b->realm = JS_DupContext(ctx);
    return obj;
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}